

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::trim_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,trim_type do_trim)

{
  iterator it_00;
  iterator it_01;
  initializer_list<cs::tree_type<cs::token_base_*>_> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<cs::statement_base_*> __l_01;
  token_id *ptVar1;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  int iVar5;
  signal_types sVar6;
  token_base **pptVar7;
  var_id *pvVar8;
  token_base *ptVar9;
  void *pvVar10;
  token_parallel *ptVar11;
  undefined8 uVar12;
  string *psVar13;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *pdVar14;
  function *this_00;
  size_type sVar15;
  object_method *poVar16;
  token_value *ptVar17;
  int in_ECX;
  uint uVar18;
  tree_node *in_RDX;
  compiler_type *in_RSI;
  tree_node *in_RDI;
  var lambda;
  function func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_2;
  iterator __end5_2;
  iterator __begin5_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_2;
  string decl;
  statement_base *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_args;
  bool find_self_ref;
  string *str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end6_1;
  iterator __begin6_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6_1;
  string *str;
  tree_type<cs::token_base_*> *item;
  iterator __end4;
  iterator __begin4;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range4;
  bool is_vargs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  token_base *rptr_6;
  token_base *lptr_3;
  token_base *rptr_5;
  token_base *lptr_2;
  token_base *rptr_4;
  token_base *rptr_3;
  token_base *lptr_1;
  token_base *rptr_2;
  token_base *rptr_1;
  token_signal *sig;
  tree_type<cs::token_base_*> *lst;
  iterator __end5;
  iterator __begin5;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range5;
  tree_type<cs::token_base_*> *tree_2;
  iterator __end6;
  iterator __begin6;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range6;
  token_parallel *parallel_list;
  token_base *rptr;
  token_base *lptr;
  tree_type<cs::token_base_*> *tree_1;
  iterator __end3;
  iterator __begin3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3;
  tree_type<cs::token_base_*> *t;
  string *id;
  token_base *token;
  undefined4 in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef5c;
  undefined4 in_stack_ffffffffffffef60;
  undefined4 uVar19;
  undefined4 in_stack_ffffffffffffef64;
  string *in_stack_ffffffffffffef68;
  token_parallel *in_stack_ffffffffffffef70;
  function *in_stack_ffffffffffffef78;
  compiler_type *in_stack_ffffffffffffef80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef88;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffef90;
  string *in_stack_ffffffffffffef98;
  undefined6 in_stack_ffffffffffffefa0;
  undefined6 uVar20;
  undefined1 in_stack_ffffffffffffefa6;
  undefined1 uVar21;
  undefined1 in_stack_ffffffffffffefa7;
  undefined1 uVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffefa8;
  statement_return *in_stack_ffffffffffffefb0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_01;
  iterator in_stack_ffffffffffffefb8;
  string *in_stack_ffffffffffffefc0;
  domain_manager *in_stack_ffffffffffffefc8;
  allocator *paVar23;
  domain_manager *in_stack_ffffffffffffefd0;
  iterator in_stack_ffffffffffffefd8;
  any *in_stack_fffffffffffff010;
  string *local_fc8;
  undefined8 in_stack_fffffffffffff050;
  undefined7 in_stack_fffffffffffff058;
  undefined1 in_stack_fffffffffffff05f;
  iterator in_stack_fffffffffffff060;
  compiler_type *in_stack_fffffffffffff078;
  iterator in_stack_fffffffffffff080;
  token_signal *local_d58;
  undefined8 ****local_ce8;
  any local_bc0 [2];
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_ba9;
  string local_b28 [232];
  string local_a40 [32];
  reference local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a08;
  allocator local_9f9;
  tree_node local_9f8;
  undefined1 local_9d1;
  tree_node *local_9c0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_9b0;
  undefined1 local_9a2;
  allocator local_9a1;
  string local_9a0 [32];
  reference local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_978;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_970;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_968;
  undefined1 local_95a;
  allocator local_959;
  string *local_958;
  string local_950 [32];
  string *local_930;
  undefined8 local_928;
  allocator local_901;
  string local_900 [32];
  tree_node *local_8e0;
  byte local_8d3;
  undefined1 local_8d2;
  allocator local_8d1;
  string local_8d0 [38];
  undefined1 local_8aa;
  allocator local_8a9;
  string local_8a8 [32];
  tree_node *local_888;
  string *local_880;
  tree_node *local_878;
  undefined1 local_86a;
  allocator local_869;
  string local_868 [32];
  reference local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_840;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_838;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_830;
  tree_node *local_828;
  string *local_820;
  tree_node *local_818;
  tree_node *local_810;
  undefined1 local_802;
  allocator local_801;
  string local_800 [32];
  tree_node *local_7e0;
  reference local_7d8;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_7b0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_790;
  byte local_781;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_780;
  undefined1 local_762;
  allocator local_761;
  string local_760 [32];
  tree_node *local_740;
  token_base *local_738;
  tree_node *local_730;
  tree_node *local_728;
  token_arglist *local_720;
  tree_node *local_718;
  undefined1 local_70a;
  allocator local_709;
  string local_708 [32];
  tree_node *local_6e8;
  token_base *local_6e0;
  tree_node *local_6d8;
  token_base *local_6d0;
  tree_node *local_6c8;
  tree_node *local_6c0;
  undefined1 local_6b1;
  tree_node *local_6b0;
  tree_node *local_6a0;
  undefined1 local_692;
  allocator local_691;
  string local_690 [32];
  tree_node *local_670;
  undefined1 local_661;
  string local_660 [38];
  undefined1 local_63a;
  allocator local_639;
  string local_638 [32];
  tree_node *local_618;
  token_id *local_610;
  tree_node *local_608;
  undefined1 local_5fa;
  allocator local_5f9;
  string local_5f8 [32];
  tree_node *local_5d8;
  token_base *local_5d0;
  tree_node *local_5c8;
  token_base *local_5c0;
  tree_node *local_5b8;
  tree_node *local_5b0;
  undefined1 local_5a2;
  allocator local_5a1;
  string local_5a0 [32];
  tree_node *local_580;
  token_base *local_578;
  tree_node *local_570;
  tree_node *local_568;
  undefined1 local_55a;
  allocator local_559;
  string local_558 [32];
  tree_node *local_538;
  tree_node *local_530;
  tree_node *local_528;
  tree_node *local_520;
  tree_node *local_518;
  undefined1 local_50a;
  allocator local_509;
  string local_508 [32];
  tree_node *local_4e8;
  tree_node *local_4e0;
  tree_node *local_4d8;
  tree_node *local_4d0;
  undefined1 local_4c2;
  allocator local_4c1;
  string local_4c0 [32];
  tree_node *local_4a0;
  undefined1 local_492;
  allocator local_491;
  string local_490 [32];
  tree_node *local_470;
  token_id *local_468;
  tree_node *local_460;
  undefined1 local_452;
  allocator local_451;
  string local_450 [32];
  tree_node *local_430;
  tree_node *local_428;
  tree_node *local_420;
  tree_node *local_418;
  tree_node *local_410;
  tree_node *local_408;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [32];
  tree_node *local_3d8;
  token_signal *local_3d0;
  tree_node *local_3c8;
  reference local_3c0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_398;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_378;
  tree_node *local_370;
  reference local_368;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_340;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_320;
  undefined1 local_312;
  tree_node *local_310;
  undefined1 ****local_308;
  undefined8 ***local_300;
  undefined1 ****local_2f8;
  undefined8 local_2f0;
  token_parallel *local_298;
  tree_node *local_290;
  token_parallel *local_288;
  tree_node *local_280;
  token_parallel *local_278;
  tree_node *local_270;
  tree_node *local_268;
  tree_node *local_260;
  tree_node *local_258;
  tree_node *local_250;
  undefined1 local_242;
  allocator local_241;
  string local_240 [32];
  tree_node *local_220;
  tree_node *local_218;
  tree_node *local_210;
  tree_node *local_208;
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  tree_node *local_1d8;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [32];
  tree_node *local_1a8;
  tree_node *local_1a0;
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  tree_node *local_170;
  undefined1 local_162;
  allocator local_161;
  string local_160 [32];
  tree_node *local_140;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  tree_node *local_110;
  reference local_108;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_e0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_c0;
  tree_node *local_b0;
  tree_type<cs::token_base_*> *local_a8;
  tree_node *local_98;
  tree_node *local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  void *local_60;
  tree_node *local_58;
  tree_node *local_50;
  tree_node *local_48;
  string *local_30;
  token_array *this_02;
  trim_type tVar24;
  undefined4 in_stack_ffffffffffffffe0;
  iterator iVar25;
  iterator local_8;
  
  uVar21 = (undefined1)((ulong)in_stack_fffffffffffff050 >> 0x38);
  iVar25.mData = in_RDI;
  local_8.mData = in_RDX;
  bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_8);
  if (!bVar2) {
    return;
  }
  pptVar7 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)
                       CONCAT17(in_stack_ffffffffffffefa7,
                                CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
  this_02 = (token_array *)*pptVar7;
  if (this_02 == (token_array *)0x0) {
    return;
  }
  iVar5 = (*(this_02->super_token_base)._vptr_token_base[2])();
  switch(iVar5) {
  case 3:
    break;
  case 4:
    if (in_ECX == 2) {
      return;
    }
    pvVar8 = token_id::get_id((token_id *)this_02);
    local_30 = var_id::operator_cast_to_string_(pvVar8);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14b590);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14b59c);
    bVar2 = domain_manager::exist_record
                      ((domain_manager *)
                       CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                       (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    if (bVar2) {
      return;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14b5c9);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14b5d5);
    bVar2 = domain_manager::exist_record_in_struct
                      (in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
    if (!bVar2) {
      return;
    }
    ptVar9 = (token_base *)
             token_base::operator_new(CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60))
    ;
    token_signal::token_signal
              ((token_signal *)in_stack_ffffffffffffefb0,
               (signal_types)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    *pptVar7 = ptVar9;
    local_48 = local_8.mData;
    local_50 = (tree_node *)
               tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                         ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffefb0,
                          in_stack_ffffffffffffefb8,(token_base **)in_stack_ffffffffffffefa8);
    local_58 = local_8.mData;
    pvVar10 = token_base::operator_new
                        (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
    local_82 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"this",&local_81);
    token_id::token_id((token_id *)
                       CONCAT17(in_stack_ffffffffffffefa7,
                                CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)),
                       in_stack_ffffffffffffef98);
    local_82 = 0;
    local_60 = pvVar10;
    local_90 = (tree_node *)
               tree_type<cs::token_base*>::emplace_left_left<cs::token_id*>
                         ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffefb0,
                          in_stack_ffffffffffffefb8,(token_id **)in_stack_ffffffffffffefa8);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_98 = local_8.mData;
    tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
              ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefb8,
               (token_base **)in_stack_ffffffffffffefa8);
    return;
  default:
    goto LAB_0014f565;
  case 0xc:
    if (in_ECX == 1) {
      return;
    }
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    tVar24 = (trim_type)((ulong)in_stack_ffffffffffffef70 >> 0x20);
    local_a8 = token_expr::get_tree((token_expr *)*pptVar7);
    trim_expression(in_stack_ffffffffffffef80,
                    (tree_type<cs::token_base_*> *)in_stack_ffffffffffffef78,tVar24);
    local_b0 = local_8.mData;
    tree_type<cs::token_base_*>::merge
              ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefb8,
               (tree_type<cs::token_base_*> *)in_stack_ffffffffffffefa8);
    return;
  case 0xe:
    local_c0 = token_array::get_array(this_02);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    while (bVar2 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffef64,
                                                     in_stack_ffffffffffffef60),
                                   (_Self *)CONCAT44(in_stack_ffffffffffffef5c,
                                                     in_stack_ffffffffffffef58)), bVar2) {
      local_108 = std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator*(&local_e0);
      trim_expression(in_stack_ffffffffffffef80,
                      (tree_type<cs::token_base_*> *)in_stack_ffffffffffffef78,
                      (trim_type)((ulong)in_stack_ffffffffffffef70 >> 0x20));
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
    }
    return;
  }
  sVar6 = token_signal::get_signal((token_signal *)this_02);
  switch(sVar6) {
  case sub_:
    local_208 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 == (token_base *)0x0) {
      ptVar9 = (token_base *)
               token_base::operator_new
                         (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      token_signal::token_signal
                ((token_signal *)in_stack_ffffffffffffefb0,
                 (signal_types)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = ptVar9;
    }
    goto LAB_0014f565;
  default:
    goto LAB_0014f565;
  case mul_:
    local_210 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 == (token_base *)0x0) {
      ptVar9 = (token_base *)
               token_base::operator_new
                         (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      token_signal::token_signal
                ((token_signal *)in_stack_ffffffffffffefb0,
                 (signal_types)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = ptVar9;
    }
    goto LAB_0014f565;
  case com_:
    local_268 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,(trim_type)((ulong)this_02 >> 0x20));
    local_270 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,(trim_type)((ulong)this_02 >> 0x20));
    local_280 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_278 = (token_parallel *)*pptVar7;
    local_290 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_288 = (token_parallel *)*pptVar7;
    if ((local_278 == (token_parallel *)0x0) && (local_288 == (token_parallel *)0x0)) {
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = (token_base *)0x0;
    }
    else {
      local_298 = (token_parallel *)0x0;
      if ((local_278 == (token_parallel *)0x0) ||
         (iVar5 = (*(local_278->super_token_base)._vptr_token_base[2])(), iVar5 != 0xf)) {
        if (local_278 == (token_parallel *)0x0) {
          ptVar11 = (token_parallel *)
                    token_base::operator_new
                              (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          (ptVar11->mTreeList).
          super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size = 0;
          (ptVar11->super_token_base)._vptr_token_base = (_func_int **)0x0;
          (ptVar11->super_token_base).line_num = 0;
          token_parallel::token_parallel(in_stack_ffffffffffffef70);
          local_298 = ptVar11;
        }
        else {
          ptVar11 = (token_parallel *)
                    token_base::operator_new
                              (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
          local_312 = 1;
          local_308 = (undefined1 ****)&local_300;
          local_310 = (tree_node *)
                      tree_type<cs::token_base_*>::iterator::left
                                ((iterator *)in_stack_ffffffffffffefa8);
          it_00.mData._4_4_ = in_stack_ffffffffffffef64;
          it_00.mData._0_4_ = in_stack_ffffffffffffef60;
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)
                     CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),it_00);
          local_2f8 = (undefined1 ****)&local_300;
          local_2f0 = 1;
          std::allocator<cs::tree_type<cs::token_base_*>_>::allocator
                    ((allocator<cs::tree_type<cs::token_base_*>_> *)0x14c4f6);
          __l._M_len._0_6_ = in_stack_ffffffffffffefa0;
          __l._M_array = (iterator)in_stack_ffffffffffffef98;
          __l._M_len._6_1_ = in_stack_ffffffffffffefa6;
          __l._M_len._7_1_ = in_stack_ffffffffffffefa7;
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   *)in_stack_ffffffffffffef90,__l,(allocator_type *)in_stack_ffffffffffffef88);
          token_parallel::token_parallel
                    ((token_parallel *)in_stack_ffffffffffffef80,
                     (deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                      *)in_stack_ffffffffffffef78);
          local_312 = 0;
          local_298 = ptVar11;
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::~deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)in_stack_ffffffffffffefb0);
          std::allocator<cs::tree_type<cs::token_base_*>_>::~allocator
                    ((allocator<cs::tree_type<cs::token_base_*>_> *)0x14c566);
          local_ce8 = &local_2f8;
          do {
            local_ce8 = local_ce8 + -1;
            tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x14c59b);
          } while (local_ce8 != &local_300);
        }
      }
      else {
        local_298 = local_278;
      }
      if ((local_288 == (token_parallel *)0x0) ||
         (iVar5 = (*(local_288->super_token_base)._vptr_token_base[2])(), iVar5 != 0xf)) {
        if (local_288 != (token_parallel *)0x0) {
          token_parallel::get_parallel(local_298);
          local_370 = (tree_node *)
                      tree_type<cs::token_base_*>::iterator::right
                                ((iterator *)in_stack_ffffffffffffefa8);
          std::deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>
          ::emplace_back<cs::tree_type<cs::token_base*>::iterator>
                    ((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                     (iterator *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        }
      }
      else {
        local_320 = token_parallel::get_parallel(local_288);
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        while (bVar2 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffef64,
                                                         in_stack_ffffffffffffef60),
                                       (_Self *)CONCAT44(in_stack_ffffffffffffef5c,
                                                         in_stack_ffffffffffffef58)), bVar2) {
          local_368 = std::
                      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                      ::operator*(&local_340);
          token_parallel::get_parallel(local_298);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::push_back((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                       *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                      (value_type *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
          std::
          _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
          ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                        *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
        }
      }
      local_378 = token_parallel::get_parallel(local_298);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      while (bVar2 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffef64,
                                                       in_stack_ffffffffffffef60),
                                     (_Self *)CONCAT44(in_stack_ffffffffffffef5c,
                                                       in_stack_ffffffffffffef58)),
            ptVar11 = local_298, bVar2) {
        local_3c0 = std::
                    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    ::operator*(&local_398);
        local_3c8 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)
                               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                  iVar25,(trim_type)((ulong)this_02 >> 0x20));
        std::
        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
        ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                      *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      }
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = &ptVar11->super_token_base;
    }
    break;
  case dot_:
    local_570 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,(trim_type)((ulong)this_02 >> 0x20));
    local_580 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_578 = *pptVar7;
    if ((local_578 == (token_base *)0x0) ||
       (iVar5 = (*local_578->_vptr_token_base[2])(), iVar5 != 4)) {
      local_5a2 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a0,"Wrong grammar for dot expression.",&local_5a1);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_5a2 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case asi_:
    local_218 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    bVar2 = true;
    if (*pptVar7 != (token_base *)0x0) {
      local_220 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right
                            ((iterator *)in_stack_ffffffffffffefa8);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      bVar2 = *pptVar7 == (token_base *)0x0;
    }
    if (bVar2) {
      local_242 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"Wrong grammar for assign expression.",&local_241);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_242 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_250 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_258 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    iVar5 = (*(*pptVar7)->_vptr_token_base[2])();
    if (iVar5 == 0xf) {
      ptVar9 = (token_base *)
               token_base::operator_new
                         (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      token_signal::token_signal
                ((token_signal *)in_stack_ffffffffffffefb0,
                 (signal_types)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = ptVar9;
    }
    local_260 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    break;
  case not_:
    local_1d8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_1fa = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"Wrong grammar for not expression.",&local_1f9);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_1fa = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_0014f565;
  case choice_:
    local_3d8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 == (token_base *)0x0) {
      local_d58 = (token_signal *)0x0;
    }
    else {
      local_d58 = (token_signal *)
                  __dynamic_cast(*pptVar7,&token_base::typeinfo,&token_signal::typeinfo,0);
    }
    local_3d0 = local_d58;
    if ((local_d58 == (token_signal *)0x0) ||
       (sVar6 = token_signal::get_signal(local_d58), sVar6 != pair_)) {
      local_3fa = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"Wrong grammar for choice expression.",&local_3f9);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_3fa = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_408 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_418 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    local_410 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_428 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    local_420 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    break;
  case emb_:
    local_6c0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_6c8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_6d8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_6d0 = *pptVar7;
    local_6e8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_6e0 = *pptVar7;
    if ((((((ulong)in_RDI->data & 1) == 0) || (local_6d0 != (token_base *)0x0)) ||
        (local_6e0 == (token_base *)0x0)) ||
       (iVar5 = (*local_6e0->_vptr_token_base[2])(), ptVar9 = local_6e0, iVar5 != 0xd)) {
      local_70a = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_708,"Wrong grammar for lambda expression.",&local_709);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_70a = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    *pptVar7 = ptVar9;
    break;
  case fcall_:
    local_5b0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_5b8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_5c8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_5c0 = *pptVar7;
    local_5d8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_5d0 = *pptVar7;
    if (((local_5c0 == (token_base *)0x0) || (local_5d0 == (token_base *)0x0)) ||
       (iVar5 = (*local_5d0->_vptr_token_base[2])(), iVar5 != 0xd)) {
      local_5fa = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f8,"Wrong syntax for function call.",&local_5f9);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_5fa = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case typeid_:
    local_1a8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_1ca = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"Wrong grammar for typeid expression.",&local_1c9);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_1ca = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_0014f565;
  case addr_:
    local_110 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_132 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"Wrong grammar for addr expression.",&local_131);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_132 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_0014f565;
  case new_:
    local_140 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_162 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"Wrong grammar for new expression.",&local_161);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_162 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
LAB_0014f565:
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    break;
  case gcnew_:
    local_170 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_192 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"Wrong grammar for gcnew expression.",&local_191);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_192 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_1a0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    break;
  case arrow_:
    local_528 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    bVar2 = true;
    if (*pptVar7 != (token_base *)0x0) {
      local_530 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right
                            ((iterator *)in_stack_ffffffffffffefa8);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      bVar2 = true;
      if (*pptVar7 != (token_base *)0x0) {
        local_538 = (tree_node *)
                    tree_type<cs::token_base_*>::iterator::right
                              ((iterator *)in_stack_ffffffffffffefa8);
        pptVar7 = tree_type<cs::token_base_*>::iterator::data
                            ((iterator *)
                             CONCAT17(in_stack_ffffffffffffefa7,
                                      CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0))
                            );
        iVar5 = (*(*pptVar7)->_vptr_token_base[2])();
        bVar2 = iVar5 != 4;
      }
    }
    if (bVar2) {
      local_55a = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_558,"Wrong grammar for arrow expression.",&local_559);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_55a = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_568 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    break;
  case lambda_:
    *(undefined1 *)&in_RDI->data = 1;
    local_718 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,(trim_type)((ulong)this_02 >> 0x20));
    *(undefined1 *)&in_RDI->data = 0;
    local_728 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_720 = (token_arglist *)*pptVar7;
    local_730 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,(trim_type)((ulong)this_02 >> 0x20));
    local_740 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_738 = *pptVar7;
    if (((local_720 == (token_arglist *)0x0) || (local_738 == (token_base *)0x0)) ||
       (iVar5 = (*(local_720->super_token_base)._vptr_token_base[2])(), iVar5 != 0xd)) {
      local_762 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"Wrong grammar for lambda expression.",&local_761);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_762 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14e15d);
    local_781 = 0;
    local_790 = token_arglist::get_arglist(local_720);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    while (bVar2 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffef64,
                                                     in_stack_ffffffffffffef60),
                                   (_Self *)CONCAT44(in_stack_ffffffffffffef5c,
                                                     in_stack_ffffffffffffef58)), bVar2) {
      local_7d8 = std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator*(&local_7b0);
      local_7e0 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)
                             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      if (*pptVar7 == (token_base *)0x0) {
        local_802 = 1;
        uVar12 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_800,"Null pointer accessed.",&local_801);
        internal_error::internal_error
                  ((internal_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                   (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        local_802 = 0;
        __cxa_throw(uVar12,&internal_error::typeinfo,internal_error::~internal_error);
      }
      local_810 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)
                             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      try_fix_this_deduction(in_stack_fffffffffffff078,in_stack_fffffffffffff080);
      local_818 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)
                             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      iVar5 = (*(*pptVar7)->_vptr_token_base[2])();
      if (iVar5 == 4) {
        local_828 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)
                               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        pptVar7 = tree_type<cs::token_base_*>::iterator::data
                            ((iterator *)
                             CONCAT17(in_stack_ffffffffffffefa7,
                                      CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0))
                            );
        pvVar8 = token_id::get_id((token_id *)*pptVar7);
        local_820 = var_id::operator_cast_to_string_(pvVar8);
        local_830 = &local_780;
        local_838._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        local_840 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58)),
              bVar2) {
          local_848 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_838);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffef80,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffef78);
          if (_Var3) {
            local_86a = 1;
            uVar12 = __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_868,"Redefinition of function argument.",&local_869);
            compile_error::compile_error
                      ((compile_error *)
                       CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                       (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
            local_86a = 0;
            __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_838);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      }
      else {
        local_878 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)
                               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        pptVar7 = tree_type<cs::token_base_*>::iterator::data
                            ((iterator *)
                             CONCAT17(in_stack_ffffffffffffefa7,
                                      CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0))
                            );
        iVar5 = (*(*pptVar7)->_vptr_token_base[2])();
        if (iVar5 != 5) {
          local_8d2 = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          paVar23 = &local_8d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_8d0,"Unexpected element in function argument list.",paVar23);
          compile_error::compile_error
                    ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                     (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
          local_8d2 = 0;
          __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
        }
        local_888 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)
                               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        pptVar7 = tree_type<cs::token_base_*>::iterator::data
                            ((iterator *)
                             CONCAT17(in_stack_ffffffffffffefa7,
                                      CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0))
                            );
        local_880 = token_vargs::get_id_abi_cxx11_((token_vargs *)*pptVar7);
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffef70);
        if (!bVar2) {
          local_8aa = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_8a8,"Redefinition of function argument(Multi-define of vargs).",
                     &local_8a9);
          compile_error::compile_error
                    ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                     (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
          local_8aa = 0;
          __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
        local_781 = 1;
      }
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
    }
    local_8e0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    paVar23 = &local_901;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"self",paVar23);
    bVar4 = find_id_ref(in_stack_ffffffffffffefd8,(string *)in_stack_ffffffffffffefd0);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    local_8d3 = bVar4 & 1;
    if (((local_781 & 1) == 0) && (local_8d3 != 0)) {
      local_95a = 1;
      paVar23 = &local_959;
      local_958 = local_950;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,"self",paVar23);
      local_95a = 0;
      local_930 = local_950;
      local_928 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x14e9e6);
      __l_00._M_len._0_6_ = in_stack_ffffffffffffefa0;
      __l_00._M_array = in_stack_ffffffffffffef98;
      __l_00._M_len._6_1_ = in_stack_ffffffffffffefa6;
      __l_00._M_len._7_1_ = in_stack_ffffffffffffefa7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffef90,__l_00,(allocator_type *)in_stack_ffffffffffffef88);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x14ea1a);
      local_fc8 = (string *)&local_930;
      do {
        local_fc8 = local_fc8 + -0x20;
        std::__cxx11::string::~string(local_fc8);
      } while (local_fc8 != local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_959);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(&local_780);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffef90,(size_type)in_stack_ffffffffffffef88);
      local_968 = &local_780;
      local_970._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_978 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58)),
            bVar2) {
        local_980 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_970);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                                (char *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58
                                                ));
        if (!bVar2) {
          local_9a2 = 1;
          uVar12 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_9a0,"Overwrite the default argument \"self\".",&local_9a1);
          runtime_error::runtime_error
                    ((runtime_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                     (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
          local_9a2 = 0;
          __cxa_throw(uVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_970);
      }
      std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffef70);
    }
    pdVar14 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
              statement_base::operator_new
                        (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
    local_9d1 = 1;
    local_9c0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    it_01.mData._4_4_ = in_stack_ffffffffffffef64;
    it_01.mData._0_4_ = in_stack_ffffffffffffef60;
    tree_type<cs::token_base_*>::tree_type
              ((tree_type<cs::token_base_*> *)
               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),it_01);
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)
               CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
               (shared_ptr<cs::context_type> *)
               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    this_00 = (function *)
              token_base::operator_new
                        (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
    token_base::get_line_num(&this_02->super_token_base);
    token_endline::token_endline
              ((token_endline *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    statement_return::statement_return
              (in_stack_ffffffffffffefb0,(tree_type<cs::token_base_*> *)in_stack_ffffffffffffefa8,
               (context_t *)
               CONCAT17(in_stack_ffffffffffffefa7,
                        CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)),
               (token_base *)in_stack_ffffffffffffef98);
    local_9d1 = 0;
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x14eeba);
    tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x14eec7);
    paVar23 = &local_9f9;
    local_9b0 = pdVar14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f8,"function [lambda](",paVar23);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    sVar15 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_780);
    if (sVar15 == 0) {
      std::__cxx11::string::operator+=((string *)&local_9f8,")");
    }
    else {
      local_a08 = &local_780;
      local_a10._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_a18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58)),
            bVar2) {
        local_a20 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_a10);
        std::operator+(in_stack_ffffffffffffef88,(char *)in_stack_ffffffffffffef80);
        std::__cxx11::string::operator+=((string *)&local_9f8,local_a40);
        std::__cxx11::string::~string(local_a40);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_a10);
      }
      in_stack_ffffffffffffefb8.mData = &local_9f8;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::size();
      in_stack_ffffffffffffefc0 =
           (string *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffefb8.mData);
      in_stack_ffffffffffffefc0->_M_dataplus = (_Alloc_hider)0x29;
    }
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)
               CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
               (shared_ptr<cs::context_type> *)
               CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    std::__cxx11::string::string(local_b28,(string *)&local_9f8);
    this_01 = local_9b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_9b0,in_stack_ffffffffffffefa8);
    local_ba9.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
    .super__Deque_impl_data._1_8_ = local_9b0;
    local_ba9.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
    .super__Deque_impl_data._9_8_ =
         (long)&local_ba9.
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_map + 1;
    local_ba9.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
    .super__Deque_impl_data._M_start._1_8_ = 1;
    pdVar14 = &local_ba9;
    std::allocator<cs::statement_base_*>::allocator((allocator<cs::statement_base_*> *)0x14f1b7);
    __l_01._M_len._0_6_ = in_stack_ffffffffffffefa0;
    __l_01._M_array = (iterator)in_stack_ffffffffffffef98;
    __l_01._M_len._6_1_ = in_stack_ffffffffffffefa6;
    __l_01._M_len._7_1_ = in_stack_ffffffffffffefa7;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              (in_stack_ffffffffffffef90,__l_01,(allocator_type *)in_stack_ffffffffffffef88);
    uVar18 = local_781 & 1;
    uVar19 = 1;
    cs::function::function
              (this_00,(context_t *)paVar23,in_stack_ffffffffffffefc0,
               (statement_base *)in_stack_ffffffffffffefb8.mData,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01,pdVar14,(bool)in_stack_ffffffffffffefa7,(bool)in_stack_ffffffffffffefa6);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque(this_01);
    std::allocator<cs::statement_base_*>::~allocator((allocator<cs::statement_base_*> *)0x14f240);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffef70);
    std::__cxx11::string::~string(local_b28);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x14f267);
    if ((local_8d3 & 1) == 0) {
      cs_impl::any::make_protect<cs::callable,cs::function&>(in_stack_ffffffffffffef78);
      ptVar17 = new_value(in_stack_ffffffffffffef80,(var *)in_stack_ffffffffffffef78);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = &ptVar17->super_token_base;
      cs_impl::any::~any((any *)0x14f4d0);
    }
    else {
      local_bc0[0].mDat = (proxy *)0x0;
      cs_impl::any::any(local_bc0);
      cs_impl::any::make_protect<cs::callable,cs::function&>(in_stack_ffffffffffffef78);
      cs_impl::any::make<cs::object_method,cs_impl::any,cs_impl::any>
                ((any *)in_stack_ffffffffffffef78,(any *)in_stack_ffffffffffffef70);
      cs_impl::any::~any((any *)0x14f2d1);
      cs_impl::any::~any((any *)0x14f2de);
      poVar16 = cs_impl::any::val<cs::object_method>(in_stack_fffffffffffff010);
      uVar20 = SUB86(poVar16,0);
      uVar21 = (undefined1)((ulong)poVar16 >> 0x30);
      uVar22 = (undefined1)((ulong)poVar16 >> 0x38);
      cs_impl::any::operator=
                ((any *)CONCAT44(in_stack_ffffffffffffef64,uVar19),
                 (any *)CONCAT44(in_stack_ffffffffffffef5c,uVar18));
      cs_impl::any::protect((any *)CONCAT17(uVar22,CONCAT16(uVar21,uVar20)));
      ptVar17 = new_value(in_stack_ffffffffffffef80,(var *)in_stack_ffffffffffffef78);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)CONCAT17(uVar22,CONCAT16(uVar21,uVar20)));
      *pptVar7 = &ptVar17->super_token_base;
      cs_impl::any::~any((any *)0x14f35f);
    }
    cs::function::~function((function *)CONCAT44(in_stack_ffffffffffffef64,uVar19));
    std::__cxx11::string::~string((string *)&local_9f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffef70);
    break;
  case vardef_:
    local_430 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_452 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450,"Wrong grammar for variable declaration.",&local_451);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_452 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_460 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_470 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    local_468 = (token_id *)*pptVar7;
    if ((local_468 == (token_id *)0x0) ||
       (iVar5 = (*(local_468->super_token_base)._vptr_token_base[2])(), iVar5 != 4)) {
      local_492 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_490,"Wrong grammar for variable declaration.",&local_491);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_492 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14ce9a);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14cea6);
    pvVar8 = token_id::get_id(local_468);
    var_id::operator_cast_to_string_(pvVar8);
    domain_manager::add_record(in_stack_ffffffffffffefd0,(string *)in_stack_ffffffffffffefc8);
    ptVar1 = local_468;
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    *pptVar7 = &ptVar1->super_token_base;
    break;
  case varchk_:
    local_4a0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_4c2 = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c0,"Wrong grammar for variable declaration.",&local_4c1);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_4c2 = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_4d0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14d074);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14d080);
    local_4d8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    instance_type::check_declar_var
              ((instance_type *)CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               in_stack_fffffffffffff060,(bool)uVar21);
    local_4e0 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    ptVar9 = *pptVar7;
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    *pptVar7 = ptVar9;
    break;
  case varprt_:
    local_4e8 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 != (token_base *)0x0) {
      local_50a = 1;
      uVar12 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_508,"Wrong grammar for variable declaration.",&local_509);
      compile_error::compile_error
                ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                 (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
      local_50a = 0;
      __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_518 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
              iVar25,tVar24);
    local_520 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_ffffffffffffefa8);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    ptVar9 = *pptVar7;
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    *pptVar7 = ptVar9;
    break;
  case vargs_:
    local_608 = (tree_node *)
                tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8);
    tVar24 = (trim_type)((ulong)this_02 >> 0x20);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffefa7,
                                  CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
    if (*pptVar7 == (token_base *)0x0) {
      local_618 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right
                            ((iterator *)in_stack_ffffffffffffefa8);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      local_610 = (token_id *)*pptVar7;
      if ((local_610 == (token_id *)0x0) ||
         (iVar5 = (*(local_610->super_token_base)._vptr_token_base[2])(), iVar5 != 4)) {
        local_63a = 1;
        uVar12 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_638,"Wrong grammar for vargs expression.",&local_639);
        compile_error::compile_error
                  ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                   (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        local_63a = 0;
        __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
      }
      ptVar9 = (token_base *)
               token_base::operator_new
                         (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      local_661 = 1;
      pvVar8 = token_id::get_id(local_610);
      psVar13 = var_id::operator_cast_to_string_(pvVar8);
      std::__cxx11::string::string(local_660,(string *)psVar13);
      token_vargs::token_vargs((token_vargs *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
      local_661 = 0;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = ptVar9;
      std::__cxx11::string::~string(local_660);
    }
    else {
      local_670 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right
                            ((iterator *)in_stack_ffffffffffffefa8);
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      if (*pptVar7 != (token_base *)0x0) {
        local_692 = 1;
        uVar12 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_690,"Wrong grammar for vargs expression.",&local_691);
        compile_error::compile_error
                  ((compile_error *)CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60),
                   (string *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
        local_692 = 0;
        __cxa_throw(uVar12,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_6a0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8)
      ;
      trim_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                iVar25,tVar24);
      ptVar9 = (token_base *)
               token_base::operator_new
                         (CONCAT44(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60));
      local_6b1 = 1;
      local_6b0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_ffffffffffffefa8)
      ;
      iVar25.mData._4_4_ = in_stack_ffffffffffffef64;
      iVar25.mData._0_4_ = in_stack_ffffffffffffef60;
      tree_type<cs::token_base_*>::tree_type
                ((tree_type<cs::token_base_*> *)
                 CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),iVar25);
      token_expand::token_expand
                ((token_expand *)in_stack_ffffffffffffef70,
                 (tree_type<cs::token_base_*> *)in_stack_ffffffffffffef68);
      local_6b1 = 0;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)
                           CONCAT17(in_stack_ffffffffffffefa7,
                                    CONCAT16(in_stack_ffffffffffffefa6,in_stack_ffffffffffffefa0)));
      *pptVar7 = ptVar9;
      tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x14dc96);
    }
  }
  return;
}

Assistant:

void
	compiler_type::trim_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, trim_type do_trim)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			if (do_trim != trim_type::no_this_deduce) {
				const std::string &id = static_cast<token_id *>(token)->get_id();
				if (!context->instance->storage.exist_record(id) &&
				        context->instance->storage.exist_record_in_struct(id)) {
					it.data() = new token_signal(signal_types::dot_);
					tree.emplace_left_left(it, token);
					tree.emplace_left_left(it, new token_id("this"));
					tree.emplace_right_right(it, token);
				}
			}
			return;
		}
		case token_types::expr: {
			if (do_trim != trim_type::no_expr_fold) {
				tree_type<token_base *> &t = static_cast<token_expr *>(it.data())->get_tree();
				trim_expression(t, do_trim);
				tree.merge(it, t);
			}
			return;
		}
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array())
				trim_expression(tree, do_trim);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::addr_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for addr expression.");
				break;
			case signal_types::new_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				break;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				trim_expr(tree, it.right(), do_trim);
				return;
				break;
			case signal_types::typeid_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for typeid expression.");
				break;
			case signal_types::not_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for not expression.");
				break;
			case signal_types::sub_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::minus_);
				break;
			case signal_types::mul_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::escape_);
				break;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				trim_expr(tree, it.left(), do_trim);
				if (it.left().data()->get_type() == token_types::parallel)
					it.data() = new token_signal(signal_types::bind_);
				trim_expr(tree, it.right(), do_trim);
				return;
			case signal_types::com_: {
				trim_expr(tree, it.left(), trim_type::no_expr_fold);
				trim_expr(tree, it.right(), trim_type::no_expr_fold);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr && rptr == nullptr)
					it.data() = nullptr;
				else {
					token_parallel *parallel_list = nullptr;
					if (lptr != nullptr && lptr->get_type() == token_types::parallel)
						parallel_list = static_cast<token_parallel *>(lptr);
					else if (lptr != nullptr)
						parallel_list = new token_parallel({tree_type<token_base *>(it.left())});
					else
						parallel_list = new token_parallel();
					if (rptr != nullptr && rptr->get_type() == token_types::parallel)
						for (auto &tree: static_cast<token_parallel *>(rptr)->get_parallel())
							parallel_list->get_parallel().push_back(tree);
					else if (rptr != nullptr)
						parallel_list->get_parallel().emplace_back(it.right());
					for (auto &lst: parallel_list->get_parallel())
						trim_expr(lst, lst.root(), do_trim);
					it.data() = parallel_list;
				}
				return;
			}
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right().left(), do_trim);
				trim_expr(tree, it.right().right(), do_trim);
				return;
			}
			case signal_types::vardef_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for variable declaration.");
				context->instance->storage.add_record(static_cast<token_id *>(rptr)->get_id());
				it.data() = rptr;
				return;
			}
			case signal_types::varchk_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				context->instance->check_declar_var(it.right(), true);
				it.data() = it.right().data();
				return;
			}
			case signal_types::varprt_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				it.data() = it.right().data();
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				trim_expr(tree, it.left(), do_trim);
				return;
			case signal_types::dot_: {
				trim_expr(tree, it.left(), do_trim);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				return;
			}
			case signal_types::fcall_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				return;
			}
			case signal_types::vargs_: {
				if (it.left().data() == nullptr) {
					token_base *rptr = it.right().data();
					if (rptr == nullptr || rptr->get_type() != token_types::id)
						throw compile_error("Wrong grammar for vargs expression.");
					it.data() = new token_vargs(static_cast<token_id *>(rptr)->get_id());
				}
				else {
					if (it.right().data() != nullptr)
						throw compile_error("Wrong grammar for vargs expression.");
					trim_expr(tree, it.left(), do_trim);
					it.data() = new token_expand(tree_type<token_base *>(it.left()));
				}
				return;
			}
			case signal_types::emb_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (!inside_lambda || lptr != nullptr || rptr == nullptr ||
				        rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				it.data() = rptr;
				return;
			}
			case signal_types::lambda_: {
				inside_lambda = true;
				trim_expr(tree, it.left(), do_trim);
				inside_lambda = false;
				token_base *lptr = it.left().data();
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || lptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				std::vector<std::string> args;
				bool is_vargs = false;
				for (auto &item: static_cast<token_arglist *>(lptr)->get_arglist()) {
					if (item.root().data() == nullptr)
						throw internal_error("Null pointer accessed.");
					try_fix_this_deduction(item.root());
					if (item.root().data()->get_type() == token_types::id) {
						const std::string &str = static_cast<token_id *>(item.root().data())->get_id();
						for (auto &it: args)
							if (it == str)
								throw compile_error("Redefinition of function argument.");
						args.push_back(str);
					}
					else if (item.root().data()->get_type() == token_types::vargs) {
						const std::string &str = static_cast<token_vargs *>(item.root().data())->get_id();
						if (!args.empty())
							throw compile_error("Redefinition of function argument(Multi-define of vargs).");
						args.push_back(str);
						is_vargs = true;
					}
					else
						throw compile_error("Unexpected element in function argument list.");
				}
				bool find_self_ref = find_id_ref(it.right(), "self");
				if (!is_vargs && find_self_ref) {
					std::vector<std::string> new_args{"self"};
					new_args.reserve(args.size());
					for (auto &name: args) {
						if (name != "self")
							new_args.emplace_back(std::move(name));
						else
							throw runtime_error("Overwrite the default argument \"self\".");
					}
					std::swap(new_args, args);
				}
				statement_base *ret = new statement_return(tree_type<token_base *>(it.right()), context,
				        new token_endline(token->get_line_num()));
#ifdef CS_DEBUGGER
				std::string decl="function [lambda](";
				if(args.size()!=0) {
					for(auto& it:args)
						decl+=it+", ";
					decl.pop_back();
					decl[decl.size()-1]=')';
				}
				else
					decl+=")";
				function func(context, decl, ret, args, std::deque<statement_base *> {ret}, is_vargs, true);
#else
				function func(context, args, std::deque<statement_base *> {ret}, is_vargs, true);
#endif
				if (find_self_ref) {
					var lambda = var::make<object_method>(var(), var::make_protect<callable>(func));
					lambda.val<object_method>().object = lambda;
					lambda.protect();
					it.data() = new_value(lambda);
				}
				else
					it.data() = new_value(var::make_protect<callable>(func));
				return;
			}
			}
		}
		}
		trim_expr(tree, it.left(), do_trim);
		trim_expr(tree, it.right(), do_trim);
	}